

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O1

_Bool fy_tag_handle_is_default(char *handle,size_t handle_size)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  long lVar3;
  _Bool _Var4;
  
  if (handle_size == 0xffffffffffffffff) {
    handle_size = strlen(handle);
  }
  _Var4 = true;
  lVar3 = 0;
  while( true ) {
    __s = fy_default_tags[lVar3]->handle;
    sVar2 = strlen(__s);
    if ((handle_size == sVar2) && (iVar1 = bcmp(handle,__s,handle_size), iVar1 == 0)) break;
    lVar3 = lVar3 + 1;
    _Var4 = lVar3 != 3;
    if (!_Var4) {
      return _Var4;
    }
  }
  return _Var4;
}

Assistant:

bool fy_tag_handle_is_default(const char *handle, size_t handle_size) {
    int i;
    const struct fy_tag *fytag;

    if (handle_size == (size_t) -1)
        handle_size = strlen(handle);

    for (i = 0; (fytag = fy_default_tags[i]) != NULL; i++) {

        if (handle_size == strlen(fytag->handle) &&
            !memcmp(handle, fytag->handle, handle_size))
            return true;

    }
    return false;
}